

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3LocateCollSeq(Parse *pParse,char *zName)

{
  CollSeq *pCVar1;
  sqlite3 *in_RSI;
  long *in_RDI;
  CollSeq *pColl;
  u8 initbusy;
  u8 enc;
  sqlite3 *db;
  undefined8 in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  char cVar2;
  char *zName_00;
  
  zName_00 = (char *)*in_RDI;
  cVar2 = zName_00[0xb5];
  pCVar1 = sqlite3FindCollSeq(in_RSI,(u8)((ulong)zName_00 >> 0x38),
                              (char *)CONCAT17(zName_00[0x5e],
                                               CONCAT16(cVar2,in_stack_ffffffffffffffe0)),
                              (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if ((cVar2 == '\0') &&
     ((pCVar1 == (CollSeq *)0x0 ||
      (pCVar1->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)))) {
    pCVar1 = sqlite3GetCollSeq((Parse *)pColl,(u8)((ulong)in_RDI >> 0x38),(CollSeq *)in_RSI,zName_00
                              );
  }
  return pCVar1;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3LocateCollSeq(Parse *pParse, const char *zName){
  sqlite3 *db = pParse->db;
  u8 enc = ENC(db);
  u8 initbusy = db->init.busy;
  CollSeq *pColl;

  pColl = sqlite3FindCollSeq(db, enc, zName, initbusy);
  if( !initbusy && (!pColl || !pColl->xCmp) ){
    pColl = sqlite3GetCollSeq(pParse, enc, pColl, zName);
  }

  return pColl;
}